

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O1

u32 __thiscall moira::Moira::computeEA<(moira::Core)2,(moira::Mode)9,4,0ull>(Moira *this,u32 n)

{
  u16 uVar1;
  u32 uVar2;
  u32 uVar3;
  
  if (n < 8) {
    uVar1 = (this->queue).irc;
    uVar2 = (this->reg).pc;
    uVar3 = uVar2 + 2;
    (this->reg).pc = uVar3;
    uVar3 = read<(moira::Core)2,(moira::AddrSpace)2,2,0ull>(this,uVar3);
    (this->queue).irc = (u16)uVar3;
    return (int)(short)uVar1 + uVar2;
  }
  __assert_fail("n < 8",
                "/workspace/llm4binary/github/license_c_cmakelists/dirkwhoffmann[P]Moira/Moira/MoiraDataflow_cpp.h"
                ,0xb,
                "u32 moira::Moira::computeEA(u32) [C = moira::Core::C68020, M = moira::Mode::DIPC, S = 4, F = 0ULL]"
               );
}

Assistant:

u32
Moira::computeEA(u32 n) {

    assert(n < 8);

    u32 result;

    switch ((int)M) {

        case 0:  // Dn
        case 1:  // An
        {
            result = n;
            break;
        }
        case 2:  // (An)
        {
            result = readA(n);
            break;
        }
        case 3:  // (An)+
        {
            result = readA(n);
            break;
        }
        case 4:  // -(An)
        {
            if ((F & IMPL_DEC) == 0) SYNC(2);
            result = readA(n) - ((n == 7 && S == Byte) ? 2 : S);
            break;
        }
        case 5: // (d,An)
        {
            u32 an = readA(n);
            i16  d = (i16)queue.irc;

            result = U32_ADD(an, d);
            if ((F & SKIP_LAST_RD) == 0) { readExt<C>(); } else { reg.pc += 2; }
            break;
        }
        case 6: // (d,An,Xi)
        {
            if constexpr (C == Core::C68020) {

                if (queue.irc & 0x100) {
                    result = computeEAfull<C, M, S, F>(readA(n));
                } else {
                    result = computeEAbrief<C, M, S, F>(readA(n));
                }

            } else {

                i8   d = (i8)queue.irc;
                u32 an = readA(n);
                u32 xi = readR((queue.irc >> 12) & 0b1111);

                result = U32_ADD3(an, d, ((queue.irc & 0x800) ? xi : SEXT<Word>(xi)));

                SYNC(2);
                if ((F & SKIP_LAST_RD) == 0) { readExt<C>(); } else { reg.pc += 2; }
            }
            break;
        }
        case 7: // ABS.W
        {
            result = (i16)queue.irc;
            readBuffer = queue.irc;

            if ((F & SKIP_LAST_RD) == 0) { readExt<C>(); } else { reg.pc += 2; }
            break;
        }
        case 8: // ABS.L
        {
            result = queue.irc << 16;
            readExt<C>();
            result |= queue.irc;
            readBuffer = queue.irc;

            if ((F & SKIP_LAST_RD) == 0) { readExt<C>(); } else { reg.pc += 2; }
            break;
        }
        case 9: // (d,PC)
        {
            i16  d = (i16)queue.irc;

            result = U32_ADD(reg.pc, d);
            if ((F & SKIP_LAST_RD) == 0) { readExt<C>(); } else { reg.pc += 2; }
            break;
        }
        case 10: // (d,PC,Xi)
        {
            if constexpr (C == Core::C68020) {

                if (queue.irc & 0x100) {
                    result = computeEAfull<C, M, S, F>(reg.pc);
                } else {
                    result = computeEAbrief<C, M, S, F>(reg.pc);
                }

            } else {

                i8   d = (i8)queue.irc;
                u32 xi = readR((queue.irc >> 12) & 0b1111);

                result = U32_ADD3(reg.pc, d, ((queue.irc & 0x800) ? xi : SEXT<Word>(xi)));
                SYNC(2);
                if ((F & SKIP_LAST_RD) == 0) { readExt<C>(); } else { reg.pc += 2; }
            }
            break;
        }
        case 11: // Im
        {
            result = readI<C, S>();
            break;
        }
        default:
        {
            fatalError;
        }
    }
    return result;
}